

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_server.c
# Opt level: O2

void http_server_acccb(void *arg)

{
  nni_aio *aio;
  nng_err nVar1;
  nng_stream *s;
  http_sconn *sc;
  
  aio = (nni_aio *)((long)arg + 0x100);
  nni_mtx_lock((nni_mtx *)((long)arg + 0xd0));
  nVar1 = nni_aio_result(aio);
  if (nVar1 == NNG_OK) {
    s = (nng_stream *)nni_aio_get_output(aio,0);
    if (*(char *)((long)arg + 0xf8) == '\x01') {
      nng_stream_free(s);
      goto LAB_00139ec3;
    }
    sc = (http_sconn *)nni_zalloc(0x7a0);
    if (sc == (http_sconn *)0x0) {
      nng_stream_free(s);
    }
    else {
      nni_aio_init(&sc->rxaio,http_sconn_rxdone,sc);
      nni_aio_init(&sc->txaio,http_sconn_txdone,sc);
      nni_aio_init(&sc->txdataio,http_sconn_txdatdone,sc);
      nni_aio_init(&sc->cbaio,http_sconn_cbdone,sc);
      nVar1 = nni_http_init(&sc->conn,s,false);
      if (nVar1 == NNG_OK) {
        nni_http_conn_set_ctx(sc->conn,sc);
        sc->server = (nni_http_server *)arg;
        nni_list_append((nni_list *)((long)arg + 0xb8),sc);
        sc->handler = (nni_http_handler *)0x0;
        nni_http_read_req(sc->conn,&sc->rxaio);
      }
      else {
        http_sconn_close(sc);
      }
    }
  }
  else if (*(char *)((long)arg + 0xf8) != '\0') goto LAB_00139ec3;
  nng_stream_listener_accept(*(nng_stream_listener **)((long)arg + 0x2c8),aio);
LAB_00139ec3:
  nni_mtx_unlock((nni_mtx *)((long)arg + 0xd0));
  return;
}

Assistant:

static void
http_server_acccb(void *arg)
{
	nni_http_server *s   = arg;
	nni_aio         *aio = &s->accaio;
	nng_stream      *stream;
	http_sconn      *sc;
	int              rv;

	nni_mtx_lock(&s->mtx);
	if ((rv = nni_aio_result(aio)) != 0) {
		if (!s->closed) {
			// try again?
			nng_stream_listener_accept(s->listener, aio);
		}
		nni_mtx_unlock(&s->mtx);
		return;
	}
	stream = nni_aio_get_output(aio, 0);
	if (s->closed) {
		// If we're closing, then reject this one.
		nng_stream_free(stream);
		nni_mtx_unlock(&s->mtx);
		return;
	}
	if (http_sconn_init(&sc, stream) != 0) {
		// The stream structure is already cleaned up.
		// Start another accept attempt.
		nng_stream_listener_accept(s->listener, aio);
		nni_mtx_unlock(&s->mtx);
		return;
	}
	sc->server = s;
	nni_list_append(&s->conns, sc);

	sc->handler = NULL;
	nni_http_read_req(sc->conn, &sc->rxaio);
	nng_stream_listener_accept(s->listener, aio);
	nni_mtx_unlock(&s->mtx);
}